

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void ForEachSortedOption(TidyDoc tdoc,OptionFunc OptionPrint)

{
  undefined1 local_3a0 [8];
  OptionDesc d;
  TidyOption *topt;
  AllOption_t tOption;
  OptionFunc OptionPrint_local;
  TidyDoc tdoc_local;
  
  tOption.topt[0x5f] = (TidyOption)OptionPrint;
  getSortedOption(tdoc,(AllOption_t *)&topt);
  for (d._120_8_ = &topt; *(long *)d._120_8_ != 0; d._120_8_ = d._120_8_ + 8) {
    GetOption(tdoc,*(TidyOption *)d._120_8_,(OptionDesc *)local_3a0);
    (*(code *)tOption.topt[0x5f])(tdoc,*(undefined8 *)d._120_8_,local_3a0);
  }
  return;
}

Assistant:

static void ForEachSortedOption( TidyDoc tdoc, OptionFunc OptionPrint )
{
    AllOption_t tOption;
    const TidyOption *topt;

    getSortedOption( tdoc, &tOption );
    for( topt = tOption.topt; *topt; ++topt)
    {
        OptionDesc d;

        GetOption( tdoc, *topt, &d );
        (*OptionPrint)( tdoc, *topt, &d );
    }
}